

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

void net_param_save_imp(net_t *n,FILE *fp)

{
  layer *plVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  int j;
  long lVar5;
  branch_layer_t *me;
  
  for (lVar4 = 0; lVar4 < n->size; lVar4 = lVar4 + 1) {
    iVar2 = is_branch_layer(n->layer[lVar4]);
    plVar1 = n->layer[lVar4];
    if (iVar2 == 0) {
      data_save(&plVar1->weight,fp);
      data_save(&n->layer[lVar4]->bias,fp);
    }
    else {
      lVar3 = 8;
      for (lVar5 = 0; lVar5 < *(int *)&plVar1[1].func; lVar5 = lVar5 + 1) {
        net_param_save_imp(*(net_t **)((long)plVar1[1].in.val + lVar3),fp);
        lVar3 = lVar3 + 0x10;
      }
    }
  }
  return;
}

Assistant:

static void net_param_save_imp(net_t *n, FILE *fp)
{
	for (int i = 0; i < n->size; ++i)
	{
		if (!is_branch_layer(n->layer[i]))
		{	
			data_save(&n->layer[i]->weight, fp);
			data_save(&n->layer[i]->bias, fp);
		} else {
			branch_layer_t *me = (branch_layer_t *)n->layer[i];
			for (int j = 0; j < me->num; ++j)
			{
				net_param_save_imp(me->branch[j].n, fp);
			}
		}
	}
}